

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

void __thiscall kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::abortRead(BlockedPumpFrom *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  AsyncPipe *this_00;
  _func_int ***ppp_Var3;
  _func_int ***ppp_Var4;
  undefined1 auVar5 [8];
  Own<kj::_::ImmediateBrokenPromiseNode> OVar6;
  StringPtr cancelReason;
  NullableValue<kj::Exception> e;
  undefined1 local_308 [8];
  PromiseNode *pPStack_300;
  BlockedPumpFrom *local_2f0;
  Runnable local_2e8;
  undefined1 *local_2e0;
  BlockedPumpFrom **local_2d8;
  NullableValue<kj::Exception> local_2d0;
  char local_170;
  Exception local_168;
  
  cancelReason.content.size_ = 0x17;
  cancelReason.content.ptr = "abortRead() was called";
  Canceler::cancel(&this->canceler,cancelReason);
  local_2d8 = &local_2f0;
  local_308 = (undefined1  [8])0x0;
  pPStack_300 = (PromiseNode *)0x0;
  local_2e8._vptr_Runnable = (_func_int **)&PTR_run_0064f018;
  local_2f0 = this;
  local_2e0 = local_308;
  kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&local_2d0,&local_2e8);
  local_170 = local_2d0.isSet;
  if (local_2d0.isSet == true) {
    local_168.ownFile.content.ptr = local_2d0.field_1.value.ownFile.content.ptr;
    local_168.ownFile.content.size_ = local_2d0.field_1.value.ownFile.content.size_;
    local_168.ownFile.content.disposer = local_2d0.field_1.value.ownFile.content.disposer;
    local_2d0.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_2d0.field_1.value.ownFile.content.size_ = 0;
    local_168.file = local_2d0.field_1.value.file;
    local_168.line = local_2d0.field_1.value.line;
    local_168.type = local_2d0.field_1.value.type;
    local_168.description.content.ptr = local_2d0.field_1.value.description.content.ptr;
    local_168.description.content.size_ = local_2d0.field_1.value.description.content.size_;
    local_168.description.content.disposer = local_2d0.field_1.value.description.content.disposer;
    local_168.context.ptr.disposer = local_2d0.field_1.value.context.ptr.disposer;
    local_2d0.field_1.value.description.content.ptr = (char *)0x0;
    local_2d0.field_1.value.description.content.size_ = 0;
    local_168.context.ptr.ptr = local_2d0.field_1.value.context.ptr.ptr;
    local_2d0.field_1.value.context.ptr.ptr = (Context *)0x0;
    memcpy(local_168.trace,(void *)((long)&local_2d0.field_1 + 0x50),0x104);
    Exception::~Exception(&local_2d0.field_1.value);
  }
  pPVar2 = pPStack_300;
  if (local_170 == '\x01') {
    OVar6 = heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_2d0,&local_168);
    auVar5 = local_308;
    local_308._4_4_ = local_2d0._4_4_;
    local_308._0_4_ = local_2d0._0_4_;
    pPVar2 = (PromiseNode *)local_2d0.field_1.value.ownFile.content.ptr;
    if (pPStack_300 != (PromiseNode *)0x0) {
      ppp_Var3 = &pPStack_300->_vptr_PromiseNode;
      ppp_Var4 = &pPStack_300->_vptr_PromiseNode;
      pPStack_300 = (PromiseNode *)local_2d0.field_1.value.ownFile.content.ptr;
      (***(_func_int ***)auVar5)(auVar5,(*ppp_Var3)[-2] + (long)ppp_Var4,OVar6.ptr);
      pPVar2 = pPStack_300;
    }
  }
  pPStack_300 = pPVar2;
  if (local_170 == '\x01') {
    Exception::~Exception(&local_168);
  }
  pDVar1 = (this->checkEofTask).super_PromiseBase.node.disposer;
  pPVar2 = (this->checkEofTask).super_PromiseBase.node.ptr;
  (this->checkEofTask).super_PromiseBase.node.disposer = (Disposer *)local_308;
  (this->checkEofTask).super_PromiseBase.node.ptr = pPStack_300;
  pPStack_300 = (PromiseNode *)0x0;
  if (pPVar2 != (PromiseNode *)0x0) {
    (**pDVar1->_vptr_Disposer)
              (pDVar1,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
  }
  pPVar2 = pPStack_300;
  if (pPStack_300 != (PromiseNode *)0x0) {
    pPStack_300 = (PromiseNode *)0x0;
    (***(_func_int ***)local_308)(local_308,(long)pPVar2 + *(long *)(*(long *)pPVar2 + -0x10));
  }
  this_00 = this->pipe;
  if ((BlockedPumpFrom *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (AsyncIoStream *)0x0;
  }
  AsyncPipe::abortRead(this_00);
  return;
}

Assistant:

void abortRead() override {
      canceler.cancel("abortRead() was called");

      // The input might have reached EOF, but we haven't detected it yet because we haven't tried
      // to read that far. If we had not optimized tryPumpFrom() and instead used the default
      // pumpTo() implementation, then the input would not have called write() again once it
      // reached EOF, and therefore the abortRead() on the other end would *not* propagate an
      // exception! We need the same behavior here. To that end, we need to detect if we're at EOF
      // by reading one last byte.
      checkEofTask = kj::evalNow([&]() {
        static char junk;
        return input.tryRead(&junk, 1, 1).then([this](uint64_t n) {
          if (n == 0) {
            fulfiller.fulfill(kj::cp(pumpedSoFar));
          } else {
            fulfiller.reject(KJ_EXCEPTION(DISCONNECTED, "read end of pipe was aborted"));
          }
        }).eagerlyEvaluate([this](kj::Exception&& e) {
          fulfiller.reject(kj::mv(e));
        });
      });

      pipe.endState(*this);
      pipe.abortRead();
    }